

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O0

int __thiscall QLabel::selectionStart(QLabel *this)

{
  QLabelPrivate *pQVar1;
  QWidgetTextControl *in_RDI;
  long in_FS_OFFSET;
  QLabelPrivate *d;
  byte local_32;
  int local_1c;
  QTextCursor local_18 [8];
  QTextCursor local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QLabel *)0x5b04a5);
  local_32 = 0;
  if (pQVar1->control != (QWidgetTextControl *)0x0) {
    QWidgetTextControl::textCursor(in_RDI);
    local_32 = QTextCursor::hasSelection();
    QTextCursor::~QTextCursor(local_10);
  }
  if ((local_32 & 1) == 0) {
    local_1c = -1;
  }
  else {
    QWidgetTextControl::textCursor(in_RDI);
    local_1c = QTextCursor::selectionStart();
    QTextCursor::~QTextCursor(local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_1c;
  }
  __stack_chk_fail();
}

Assistant:

int QLabel::selectionStart() const
{
    Q_D(const QLabel);
    if (d->control && d->control->textCursor().hasSelection())
        return d->control->textCursor().selectionStart();
    return -1;
}